

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O1

Data128 Centaurus::pack_charclass(CharClass<wchar_t> *cc)

{
  pointer pRVar1;
  ulong uVar2;
  long lVar3;
  int i;
  ulong uVar4;
  undefined2 uVar5;
  short sVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  long lVar9;
  Data128 d128;
  
  pRVar1 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(cc->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 4;
  lVar3 = 0;
  uVar4 = 0;
  do {
    wVar7 = L'\0';
    wVar8 = L'\0';
    if (uVar4 < uVar2) {
      wVar8 = (&pRVar1->m_start)[lVar3 * 2];
      wVar7 = (&pRVar1->m_end)[lVar3 * 2];
    }
    if (wVar8 == wVar7) {
      *(undefined2 *)((long)&d128 + lVar3 * 2) = 0xffff;
      sVar6 = 0;
      lVar9 = uVar4 * 2;
    }
    else {
      if (uVar4 < uVar2) {
        uVar5 = (undefined2)(&pRVar1->m_start)[lVar3 * 2];
      }
      else {
        uVar5 = 0;
      }
      *(undefined2 *)((long)&d128 + lVar3 * 2) = uVar5;
      sVar6 = -1;
      lVar9 = lVar3;
      if (uVar4 < uVar2) {
        sVar6 = (short)(&pRVar1->m_end)[lVar3 * 2] + -1;
      }
    }
    *(short *)((long)&d128 + lVar9 * 2 + 2) = sVar6;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  return d128;
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<wchar_t>& cc)
{
    asmjit::Data128 d128;

    for (int i = 0; i < 4; i++)
    {
        if (cc[i].empty())
        {
            d128.uw[i * 2 + 0] = 0xFFFF;
            d128.uw[i * 2 + 1] = 0;
        }
        else
        {
            d128.uw[i * 2 + 0] = cc[i].start();
            d128.uw[i * 2 + 1] = cc[i].end() - 1;
        }
    }

    return d128;
}